

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateHandler.cxx
# Opt level: O0

int __thiscall cmCTestUpdateHandler::ProcessHandler(cmCTestUpdateHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  pointer pcVar6;
  string *psVar7;
  int local_1bec;
  string local_19d0 [32];
  undefined1 local_19b0 [8];
  ostringstream cmCTestLog_msg_9;
  string local_1838 [32];
  undefined1 local_1818 [8];
  ostringstream cmCTestLog_msg_8;
  allocator<char> local_1699;
  string local_1698;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_1678;
  duration<long,_std::ratio<1L,_1000000000L>_> local_1670;
  duration<long,_std::ratio<60L,_1L>_> local_1668;
  rep local_1660;
  allocator<char> local_1651;
  string local_1650;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_1630;
  allocator<char> local_1621;
  string local_1620;
  allocator<char> local_15f9;
  string local_15f8;
  undefined1 local_15d8 [8];
  string end_time;
  undefined1 local_1598 [8];
  ostringstream cmCTestLog_msg_7;
  string local_1420 [32];
  undefined1 local_1400 [8];
  ostringstream cmCTestLog_msg_6;
  string local_1280 [4];
  int numConflicting;
  undefined1 local_1260 [8];
  ostringstream cmCTestLog_msg_5;
  string local_10e0 [4];
  int numModified;
  undefined1 local_10c0 [8];
  ostringstream cmCTestLog_msg_4;
  int local_f40;
  int numUpdated;
  int localModifications;
  bool loadedMods;
  allocator<char> local_f29;
  string local_f28;
  allocator<char> local_f01;
  string local_f00;
  allocator<char> local_ed9;
  string local_ed8;
  allocator<char> local_eb1;
  string local_eb0;
  string local_e90;
  string local_e70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e30;
  allocator<char> local_e09;
  string local_e08;
  allocator<char> local_de1;
  string local_de0;
  allocator<char> local_db9;
  string local_db8;
  string local_d98;
  allocator<char> local_d71;
  string local_d70;
  allocator<char> local_d49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d28;
  allocator<char> local_d01;
  string local_d00;
  undefined1 local_ce0 [8];
  cmXMLWriter xml;
  string local_c80;
  string local_c60;
  undefined1 local_c40 [8];
  string buildname;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_c18;
  bool updated;
  time_point elapsed_time_start;
  time_point start_time_time;
  string start_time;
  undefined1 local_bc8 [8];
  ostringstream cmCTestLog_msg_3;
  undefined1 local_a50 [8];
  cmGeneratedFileStream os;
  string local_800;
  unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_> local_7e0;
  unique_ptr<cmCTestP4,_std::default_delete<cmCTestP4>_> local_7d8;
  unique_ptr<cmCTestHG,_std::default_delete<cmCTestHG>_> local_7d0;
  unique_ptr<cmCTestGIT,_std::default_delete<cmCTestGIT>_> local_7c8;
  unique_ptr<cmCTestBZR,_std::default_delete<cmCTestBZR>_> local_7c0;
  unique_ptr<cmCTestSVN,_std::default_delete<cmCTestSVN>_> local_7b8;
  unique_ptr<cmCTestCVS,_std::default_delete<cmCTestCVS>_> local_7b0;
  unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_> local_7a8;
  unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_> vc;
  undefined1 local_780 [8];
  ostringstream cmCTestLog_msg_2;
  string local_608 [32];
  undefined1 local_5e8 [8];
  ostringstream cmCTestLog_msg_1;
  undefined1 local_470 [8];
  cmGeneratedFileStream ofs;
  string local_220 [32];
  undefined1 local_200 [8];
  ostringstream cmCTestLog_msg;
  allocator<char> local_71;
  string local_70;
  char *local_50;
  char *sourceDirectory;
  cmCLocaleEnvironmentScope fixLocale;
  cmCTestUpdateHandler *this_local;
  
  fixLocale.EnvironmentBackup._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  cmCLocaleEnvironmentScope::cmCLocaleEnvironmentScope
            ((cmCLocaleEnvironmentScope *)&sourceDirectory);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"SourceDirectory",&local_71);
  pcVar4 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  local_50 = pcVar4;
  if (pcVar4 == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    poVar5 = std::operator<<((ostream *)local_200,
                             "Cannot find SourceDirectory  key in the DartConfiguration.tcl");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                 ,0x72,pcVar4,false);
    std::__cxx11::string::~string(local_220);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
    this_local._4_4_ = -1;
    ofs._580_4_ = 1;
  }
  else {
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_470,None);
    bVar2 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
    if (!bVar2) {
      cmCTestGenericHandler::StartLogFile
                (&this->super_cmCTestGenericHandler,"Update",(cmGeneratedFileStream *)local_470);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5e8);
    poVar5 = std::operator<<((ostream *)local_5e8,"   Updating the repository: ");
    poVar5 = std::operator<<(poVar5,local_50);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                 ,0x7e,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string(local_608);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5e8);
    bVar2 = SelectVCS(this);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_780);
      poVar5 = std::operator<<((ostream *)local_780,"   Use ");
      pcVar4 = cmCTestUpdateHandlerUpdateToString(this->UpdateType);
      poVar5 = std::operator<<(poVar5,pcVar4);
      poVar5 = std::operator<<(poVar5," repository type");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                   ,0x88,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string((string *)&vc);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_780);
      std::unique_ptr<cmCTestVC,std::default_delete<cmCTestVC>>::
      unique_ptr<std::default_delete<cmCTestVC>,void>
                ((unique_ptr<cmCTestVC,std::default_delete<cmCTestVC>> *)&local_7a8);
      switch(this->UpdateType) {
      case 1:
        std::make_unique<cmCTestCVS,cmCTest*&,cmGeneratedFileStream&>
                  ((cmCTest **)&local_7b0,
                   (cmGeneratedFileStream *)&(this->super_cmCTestGenericHandler).CTest);
        std::unique_ptr<cmCTestVC,std::default_delete<cmCTestVC>>::operator=
                  ((unique_ptr<cmCTestVC,std::default_delete<cmCTestVC>> *)&local_7a8,&local_7b0);
        std::unique_ptr<cmCTestCVS,_std::default_delete<cmCTestCVS>_>::~unique_ptr(&local_7b0);
        break;
      case 2:
        std::make_unique<cmCTestSVN,cmCTest*&,cmGeneratedFileStream&>
                  ((cmCTest **)&local_7b8,
                   (cmGeneratedFileStream *)&(this->super_cmCTestGenericHandler).CTest);
        std::unique_ptr<cmCTestVC,std::default_delete<cmCTestVC>>::operator=
                  ((unique_ptr<cmCTestVC,std::default_delete<cmCTestVC>> *)&local_7a8,&local_7b8);
        std::unique_ptr<cmCTestSVN,_std::default_delete<cmCTestSVN>_>::~unique_ptr(&local_7b8);
        break;
      case 3:
        std::make_unique<cmCTestBZR,cmCTest*&,cmGeneratedFileStream&>
                  ((cmCTest **)&local_7c0,
                   (cmGeneratedFileStream *)&(this->super_cmCTestGenericHandler).CTest);
        std::unique_ptr<cmCTestVC,std::default_delete<cmCTestVC>>::operator=
                  ((unique_ptr<cmCTestVC,std::default_delete<cmCTestVC>> *)&local_7a8,&local_7c0);
        std::unique_ptr<cmCTestBZR,_std::default_delete<cmCTestBZR>_>::~unique_ptr(&local_7c0);
        break;
      case 4:
        std::make_unique<cmCTestGIT,cmCTest*&,cmGeneratedFileStream&>
                  ((cmCTest **)&local_7c8,
                   (cmGeneratedFileStream *)&(this->super_cmCTestGenericHandler).CTest);
        std::unique_ptr<cmCTestVC,std::default_delete<cmCTestVC>>::operator=
                  ((unique_ptr<cmCTestVC,std::default_delete<cmCTestVC>> *)&local_7a8,&local_7c8);
        std::unique_ptr<cmCTestGIT,_std::default_delete<cmCTestGIT>_>::~unique_ptr(&local_7c8);
        break;
      case 5:
        std::make_unique<cmCTestHG,cmCTest*&,cmGeneratedFileStream&>
                  ((cmCTest **)&local_7d0,
                   (cmGeneratedFileStream *)&(this->super_cmCTestGenericHandler).CTest);
        std::unique_ptr<cmCTestVC,std::default_delete<cmCTestVC>>::operator=
                  ((unique_ptr<cmCTestVC,std::default_delete<cmCTestVC>> *)&local_7a8,&local_7d0);
        std::unique_ptr<cmCTestHG,_std::default_delete<cmCTestHG>_>::~unique_ptr(&local_7d0);
        break;
      case 6:
        std::make_unique<cmCTestP4,cmCTest*&,cmGeneratedFileStream&>
                  ((cmCTest **)&local_7d8,
                   (cmGeneratedFileStream *)&(this->super_cmCTestGenericHandler).CTest);
        std::unique_ptr<cmCTestVC,std::default_delete<cmCTestVC>>::operator=
                  ((unique_ptr<cmCTestVC,std::default_delete<cmCTestVC>> *)&local_7a8,&local_7d8);
        std::unique_ptr<cmCTestP4,_std::default_delete<cmCTestP4>_>::~unique_ptr(&local_7d8);
        break;
      default:
        std::make_unique<cmCTestVC,cmCTest*&,cmGeneratedFileStream&>
                  ((cmCTest **)&local_7e0,
                   (cmGeneratedFileStream *)&(this->super_cmCTestGenericHandler).CTest);
        std::unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_>::operator=
                  (&local_7a8,&local_7e0);
        std::unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_>::~unique_ptr(&local_7e0);
      }
      pcVar6 = std::unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_>::operator->(&local_7a8);
      cmCTestVC::SetCommandLineTool(pcVar6,&this->UpdateCommand);
      pcVar6 = std::unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_>::operator->(&local_7a8);
      pcVar4 = local_50;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_800,pcVar4,(allocator<char> *)&os.field_0x247);
      cmCTestVC::SetSourceDirectory(pcVar6,&local_800);
      std::__cxx11::string::~string((string *)&local_800);
      std::allocator<char>::~allocator((allocator<char> *)&os.field_0x247);
      pcVar6 = std::unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_>::operator->(&local_7a8);
      cmCTestVC::Cleanup(pcVar6);
      cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_a50,None);
      bVar2 = cmCTestGenericHandler::StartResultingXML
                        (&this->super_cmCTestGenericHandler,PartUpdate,"Update",
                         (cmGeneratedFileStream *)local_a50);
      if (bVar2) {
        cmCTest::CurrentTime_abi_cxx11_
                  ((string *)&start_time_time,(this->super_cmCTestGenericHandler).CTest);
        elapsed_time_start.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        tStack_c18.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
        pcVar6 = std::unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_>::operator->(&local_7a8)
        ;
        buildname.field_2._M_local_buf[0xf] = cmCTestVC::Update(pcVar6);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c80,"BuildName",(allocator<char> *)&xml.field_0x57);
        cmCTest::GetCTestConfiguration(&local_c60,pcVar1,&local_c80);
        cmCTest::SafeBuildIdField((string *)local_c40,&local_c60);
        std::__cxx11::string::~string((string *)&local_c60);
        std::__cxx11::string::~string((string *)&local_c80);
        std::allocator<char>::~allocator((allocator<char> *)&xml.field_0x57);
        cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_ce0,(ostream *)local_a50,0);
        cmXMLWriter::StartDocument((cmXMLWriter *)local_ce0,"UTF-8");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_d00,"Update",&local_d01)
        ;
        cmXMLWriter::StartElement((cmXMLWriter *)local_ce0,&local_d00);
        std::__cxx11::string::~string((string *)&local_d00);
        std::allocator<char>::~allocator(&local_d01);
        cmXMLWriter::Attribute<char[7]>((cmXMLWriter *)local_ce0,"mode",(char (*) [7])0x84ce26);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_d48,"ctest-",&local_d49)
        ;
        pcVar4 = cmVersion::GetCMakeVersion();
        std::operator+(&local_d28,&local_d48,pcVar4);
        cmXMLWriter::Attribute<std::__cxx11::string>
                  ((cmXMLWriter *)local_ce0,"Generator",&local_d28);
        std::__cxx11::string::~string((string *)&local_d28);
        std::__cxx11::string::~string((string *)&local_d48);
        std::allocator<char>::~allocator(&local_d49);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_d70,"Site",&local_d71);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_db8,"Site",&local_db9);
        cmCTest::GetCTestConfiguration(&local_d98,pcVar1,&local_db8);
        cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_ce0,&local_d70,&local_d98);
        std::__cxx11::string::~string((string *)&local_d98);
        std::__cxx11::string::~string((string *)&local_db8);
        std::allocator<char>::~allocator(&local_db9);
        std::__cxx11::string::~string((string *)&local_d70);
        std::allocator<char>::~allocator(&local_d71);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_de0,"BuildName",&local_de1);
        cmXMLWriter::Element<std::__cxx11::string>
                  ((cmXMLWriter *)local_ce0,&local_de0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c40);
        std::__cxx11::string::~string((string *)&local_de0);
        std::allocator<char>::~allocator(&local_de1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e08,"BuildStamp",&local_e09);
        cmCTest::GetCurrentTag_abi_cxx11_(&local_e70,(this->super_cmCTestGenericHandler).CTest);
        std::operator+(&local_e50,&local_e70,"-");
        cmCTest::GetTestModelString_abi_cxx11_(&local_e90,(this->super_cmCTestGenericHandler).CTest)
        ;
        std::operator+(&local_e30,&local_e50,&local_e90);
        cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_ce0,&local_e08,&local_e30);
        std::__cxx11::string::~string((string *)&local_e30);
        std::__cxx11::string::~string((string *)&local_e90);
        std::__cxx11::string::~string((string *)&local_e50);
        std::__cxx11::string::~string((string *)&local_e70);
        std::__cxx11::string::~string((string *)&local_e08);
        std::allocator<char>::~allocator(&local_e09);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_eb0,"StartDateTime",&local_eb1);
        cmXMLWriter::Element<std::__cxx11::string>
                  ((cmXMLWriter *)local_ce0,&local_eb0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &start_time_time);
        std::__cxx11::string::~string((string *)&local_eb0);
        std::allocator<char>::~allocator(&local_eb1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ed8,"StartTime",&local_ed9);
        cmXMLWriter::
        Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                  ((cmXMLWriter *)local_ce0,&local_ed8,
                   (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)&elapsed_time_start);
        std::__cxx11::string::~string((string *)&local_ed8);
        std::allocator<char>::~allocator(&local_ed9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f00,"UpdateCommand",&local_f01);
        pcVar6 = std::unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_>::operator->(&local_7a8)
        ;
        psVar7 = cmCTestVC::GetUpdateCommandLine_abi_cxx11_(pcVar6);
        cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_ce0,&local_f00,psVar7);
        std::__cxx11::string::~string((string *)&local_f00);
        std::allocator<char>::~allocator(&local_f01);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f28,"UpdateType",&local_f29);
        _localModifications = cmCTestUpdateHandlerUpdateToString(this->UpdateType);
        cmXMLWriter::Element<char_const*>
                  ((cmXMLWriter *)local_ce0,&local_f28,(char **)&localModifications);
        std::__cxx11::string::~string((string *)&local_f28);
        std::allocator<char>::~allocator(&local_f29);
        pcVar6 = std::unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_>::operator->(&local_7a8)
        ;
        bVar2 = cmCTestVC::WriteXML(pcVar6,(cmXMLWriter *)local_ce0);
        local_f40 = 0;
        pcVar6 = std::unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_>::operator->(&local_7a8)
        ;
        local_1bec = cmCTestVC::GetPathCount(pcVar6,PathUpdated);
        if (local_1bec != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_10c0);
          poVar5 = std::operator<<((ostream *)local_10c0,"   Found ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1bec);
          std::operator<<(poVar5," updated files\n");
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                       ,0xd2,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_10e0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_10c0);
        }
        pcVar6 = std::unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_>::operator->(&local_7a8)
        ;
        iVar3 = cmCTestVC::GetPathCount(pcVar6,PathModified);
        if (iVar3 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1260);
          poVar5 = std::operator<<((ostream *)local_1260,"   Found ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
          std::operator<<(poVar5," locally modified files\n");
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                       ,0xd7,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_1280);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1260);
          local_f40 = iVar3;
        }
        pcVar6 = std::unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_>::operator->(&local_7a8)
        ;
        iVar3 = cmCTestVC::GetPathCount(pcVar6,PathConflicting);
        if (iVar3 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1400);
          poVar5 = std::operator<<((ostream *)local_1400,"   Found ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
          std::operator<<(poVar5," conflicting files\n");
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                       ,0xdd,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_1420);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1400);
          local_f40 = iVar3 + local_f40;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1598);
        poVar5 = std::operator<<((ostream *)local_1598,"End");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                     ,0xe1,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string((string *)(end_time.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1598);
        cmCTest::CurrentTime_abi_cxx11_
                  ((string *)local_15d8,(this->super_cmCTestGenericHandler).CTest);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_15f8,"EndDateTime",&local_15f9);
        cmXMLWriter::Element<std::__cxx11::string>
                  ((cmXMLWriter *)local_ce0,&local_15f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_15d8);
        std::__cxx11::string::~string((string *)&local_15f8);
        std::allocator<char>::~allocator(&local_15f9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1620,"EndTime",&local_1621);
        local_1630.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        cmXMLWriter::
        Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                  ((cmXMLWriter *)local_ce0,&local_1620,&local_1630);
        std::__cxx11::string::~string((string *)&local_1620);
        std::allocator<char>::~allocator(&local_1621);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1650,"ElapsedMinutes",&local_1651);
        local_1678.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
        local_1670.__r = (rep)std::chrono::operator-(&local_1678,&stack0xfffffffffffff3e8);
        local_1668.__r =
             (rep)std::chrono::
                  duration_cast<std::chrono::duration<long,std::ratio<60l,1l>>,long,std::ratio<1l,1000000000l>>
                            (&local_1670);
        local_1660 = std::chrono::duration<long,_std::ratio<60L,_1L>_>::count(&local_1668);
        cmXMLWriter::Element<long>((cmXMLWriter *)local_ce0,&local_1650,&local_1660);
        std::__cxx11::string::~string((string *)&local_1650);
        std::allocator<char>::~allocator(&local_1651);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1698,"UpdateReturnStatus",&local_1699);
        cmXMLWriter::StartElement((cmXMLWriter *)local_ce0,&local_1698);
        std::__cxx11::string::~string((string *)&local_1698);
        std::allocator<char>::~allocator(&local_1699);
        if (local_f40 != 0) {
          cmXMLWriter::Content<char[72]>
                    ((cmXMLWriter *)local_ce0,
                     (char (*) [72])
                     "Update error: There are modified or conflicting files in the repository");
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1818);
          poVar5 = std::operator<<((ostream *)local_1818,
                                   "   There are modified or conflicting files in the repository");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                       ,0xf0,pcVar4,false);
          std::__cxx11::string::~string(local_1838);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1818);
        }
        if ((buildname.field_2._M_local_buf[0xf] & 1U) == 0) {
          cmXMLWriter::Content<char[24]>
                    ((cmXMLWriter *)local_ce0,(char (*) [24])"Update command failed:\n");
          pcVar6 = std::unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_>::operator->
                             (&local_7a8);
          psVar7 = cmCTestVC::GetUpdateCommandLine_abi_cxx11_(pcVar6);
          cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_ce0,psVar7);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_19b0);
          poVar5 = std::operator<<((ostream *)local_19b0,"   Update command failed: ");
          pcVar6 = std::unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_>::operator->
                             (&local_7a8);
          psVar7 = cmCTestVC::GetUpdateCommandLine_abi_cxx11_(pcVar6);
          poVar5 = std::operator<<(poVar5,(string *)psVar7);
          std::operator<<(poVar5,"\n");
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                       ,0xf7,pcVar4,false);
          std::__cxx11::string::~string(local_19d0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_19b0);
        }
        cmXMLWriter::EndElement((cmXMLWriter *)local_ce0);
        cmXMLWriter::EndElement((cmXMLWriter *)local_ce0);
        cmXMLWriter::EndDocument((cmXMLWriter *)local_ce0);
        if (((buildname.field_2._M_local_buf[0xf] & 1U) == 0) || (!bVar2)) {
          local_1bec = -1;
        }
        this_local._4_4_ = local_1bec;
        ofs._580_4_ = 1;
        std::__cxx11::string::~string((string *)local_15d8);
        cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_ce0);
        std::__cxx11::string::~string((string *)local_c40);
        std::__cxx11::string::~string((string *)&start_time_time);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_bc8);
        poVar5 = std::operator<<((ostream *)local_bc8,"Cannot open log file");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                     ,0xaf,pcVar4,false);
        std::__cxx11::string::~string((string *)(start_time.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_bc8);
        this_local._4_4_ = -1;
        ofs._580_4_ = 1;
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_a50);
      std::unique_ptr<cmCTestVC,_std::default_delete<cmCTestVC>_>::~unique_ptr(&local_7a8);
    }
    else {
      this_local._4_4_ = -1;
      ofs._580_4_ = 1;
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_470);
  }
  cmCLocaleEnvironmentScope::~cmCLocaleEnvironmentScope
            ((cmCLocaleEnvironmentScope *)&sourceDirectory);
  return this_local._4_4_;
}

Assistant:

int cmCTestUpdateHandler::ProcessHandler()
{
  // Make sure VCS tool messages are in English so we can parse them.
  cmCLocaleEnvironmentScope fixLocale;
  static_cast<void>(fixLocale);

  // Get source dir
  const char* sourceDirectory = this->GetOption("SourceDirectory");
  if (!sourceDirectory) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find SourceDirectory  key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  cmGeneratedFileStream ofs;
  if (!this->CTest->GetShowOnly()) {
    this->StartLogFile("Update", ofs);
  }

  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "   Updating the repository: " << sourceDirectory
                                                    << std::endl,
                     this->Quiet);

  if (!this->SelectVCS()) {
    return -1;
  }

  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "   Use "
                       << cmCTestUpdateHandlerUpdateToString(this->UpdateType)
                       << " repository type" << std::endl;
                     , this->Quiet);

  // Create an object to interact with the VCS tool.
  std::unique_ptr<cmCTestVC> vc;
  switch (this->UpdateType) {
    case e_CVS:
      vc = cm::make_unique<cmCTestCVS>(this->CTest, ofs);
      break;
    case e_SVN:
      vc = cm::make_unique<cmCTestSVN>(this->CTest, ofs);
      break;
    case e_BZR:
      vc = cm::make_unique<cmCTestBZR>(this->CTest, ofs);
      break;
    case e_GIT:
      vc = cm::make_unique<cmCTestGIT>(this->CTest, ofs);
      break;
    case e_HG:
      vc = cm::make_unique<cmCTestHG>(this->CTest, ofs);
      break;
    case e_P4:
      vc = cm::make_unique<cmCTestP4>(this->CTest, ofs);
      break;
    default:
      vc = cm::make_unique<cmCTestVC>(this->CTest, ofs);
      break;
  }
  vc->SetCommandLineTool(this->UpdateCommand);
  vc->SetSourceDirectory(sourceDirectory);

  // Cleanup the working tree.
  vc->Cleanup();

  //
  // Now update repository and remember what files were updated
  //
  cmGeneratedFileStream os;
  if (!this->StartResultingXML(cmCTest::PartUpdate, "Update", os)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot open log file" << std::endl);
    return -1;
  }
  std::string start_time = this->CTest->CurrentTime();
  auto start_time_time = std::chrono::system_clock::now();
  auto elapsed_time_start = std::chrono::steady_clock::now();

  bool updated = vc->Update();
  std::string buildname =
    cmCTest::SafeBuildIdField(this->CTest->GetCTestConfiguration("BuildName"));

  cmXMLWriter xml(os);
  xml.StartDocument();
  xml.StartElement("Update");
  xml.Attribute("mode", "Client");
  xml.Attribute("Generator",
                std::string("ctest-") + cmVersion::GetCMakeVersion());
  xml.Element("Site", this->CTest->GetCTestConfiguration("Site"));
  xml.Element("BuildName", buildname);
  xml.Element("BuildStamp",
              this->CTest->GetCurrentTag() + "-" +
                this->CTest->GetTestModelString());
  xml.Element("StartDateTime", start_time);
  xml.Element("StartTime", start_time_time);
  xml.Element("UpdateCommand", vc->GetUpdateCommandLine());
  xml.Element("UpdateType",
              cmCTestUpdateHandlerUpdateToString(this->UpdateType));

  bool loadedMods = vc->WriteXML(xml);

  int localModifications = 0;
  int numUpdated = vc->GetPathCount(cmCTestVC::PathUpdated);
  if (numUpdated) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "   Found " << numUpdated << " updated files\n",
                       this->Quiet);
  }
  if (int numModified = vc->GetPathCount(cmCTestVC::PathModified)) {
    cmCTestOptionalLog(
      this->CTest, HANDLER_OUTPUT,
      "   Found " << numModified << " locally modified files\n", this->Quiet);
    localModifications += numModified;
  }
  if (int numConflicting = vc->GetPathCount(cmCTestVC::PathConflicting)) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "   Found " << numConflicting << " conflicting files\n",
                       this->Quiet);
    localModifications += numConflicting;
  }

  cmCTestOptionalLog(this->CTest, DEBUG, "End" << std::endl, this->Quiet);
  std::string end_time = this->CTest->CurrentTime();
  xml.Element("EndDateTime", end_time);
  xml.Element("EndTime", std::chrono::system_clock::now());
  xml.Element("ElapsedMinutes",
              std::chrono::duration_cast<std::chrono::minutes>(
                std::chrono::steady_clock::now() - elapsed_time_start)
                .count());

  xml.StartElement("UpdateReturnStatus");
  if (localModifications) {
    xml.Content("Update error: "
                "There are modified or conflicting files in the repository");
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "   There are modified or conflicting files in the repository"
                 << std::endl);
  }
  if (!updated) {
    xml.Content("Update command failed:\n");
    xml.Content(vc->GetUpdateCommandLine());
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               "   Update command failed: " << vc->GetUpdateCommandLine()
                                            << "\n");
  }
  xml.EndElement(); // UpdateReturnStatus
  xml.EndElement(); // Update
  xml.EndDocument();
  return updated && loadedMods ? numUpdated : -1;
}